

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.hpp
# Opt level: O0

iterator __thiscall
nestl::impl::detail::
rb_tree<int,int,nestl::impl::detail::identity<int>,std::less<int>,nestl::test::allocator_with_state<int>>
::m_insert_<nestl::has_exceptions::exception_ptr_error,int>
          (rb_tree<int,int,nestl::impl::detail::identity<int>,std::less<int>,nestl::test::allocator_with_state<int>>
           *this,exception_ptr_error *err,base_ptr x,base_ptr p,int *v)

{
  bool bVar1;
  link_type prVar2;
  int *__x;
  int *__y;
  bool local_49;
  link_type l;
  int *piStack_38;
  bool insert_left;
  int *v_local;
  base_ptr p_local;
  base_ptr x_local;
  exception_ptr_error *err_local;
  rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::allocator_with_state<int>_>
  *this_local;
  
  local_49 = true;
  piStack_38 = v;
  v_local = (int *)p;
  p_local = x;
  x_local = (base_ptr)err;
  err_local = (exception_ptr_error *)this;
  if (x == (base_ptr)0x0) {
    prVar2 = rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::allocator_with_state<int>_>
             ::m_end((rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::allocator_with_state<int>_>
                      *)this);
    local_49 = true;
    if ((link_type)p != prVar2) {
      __x = identity<int>::operator()((identity<int> *)((long)&l + 6),piStack_38);
      __y = rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::allocator_with_state<int>_>
            ::s_key((const_base_ptr)v_local);
      local_49 = std::less<int>::operator()((less<int> *)(this + 0x10),__x,__y);
    }
  }
  l._7_1_ = local_49;
  prVar2 = m_create_node<nestl::has_exceptions::exception_ptr_error,int>
                     (this,(exception_ptr_error *)x_local,piStack_38);
  bVar1 = has_exceptions::exception_ptr_error::operator_cast_to_bool((exception_ptr_error *)x_local)
  ;
  if (bVar1) {
    this_local = (rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::allocator_with_state<int>_>
                  *)rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::allocator_with_state<int>_>
                    ::end((rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::allocator_with_state<int>_>
                           *)this);
  }
  else {
    rb_tree_insert_and_rebalance
              ((bool)(l._7_1_ & 1),&prVar2->super_rb_tree_node_base,(rb_tree_node_base *)v_local,
               (rb_tree_node_base *)(this + 0x18));
    *(long *)(this + 0x38) = *(long *)(this + 0x38) + 1;
    rb_tree_iterator<int>::rb_tree_iterator((rb_tree_iterator<int> *)&this_local,prVar2);
  }
  return (iterator)(base_ptr)this_local;
}

Assistant:

typename rb_tree<Key, Val, KeyOfValue, Compare, Alloc>::iterator
rb_tree<Key, Val, KeyOfValue, Compare, Alloc>::m_insert_(OperationError& err, base_ptr x, base_ptr p, Arg&& v) NESTL_NOEXCEPT_SPEC
{
    bool insert_left = (x != 0 || p == m_end()
                        || m_impl.m_key_compare(KeyOfValue()(v), s_key(p)));

    link_type l = m_create_node(err, std::forward<Arg>(v));
    if (err)
    {
        return end();
    }

    rb_tree_insert_and_rebalance(insert_left, l, p, this->m_impl.m_header);
    ++m_impl.m_node_count;
    return iterator(l);
}